

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# act_wiz.c
# Opt level: O3

void do_nochannels(CHAR_DATA *ch,char *argument)

{
  ulong uVar1;
  CHAR_DATA *ch_00;
  char *__format;
  char *pcVar2;
  char buf [4608];
  char arg [4608];
  char acStack_2418 [4608];
  char local_1218 [4616];
  
  one_argument(argument,local_1218);
  if (local_1218[0] == '\0') {
    pcVar2 = "Nochannel whom?\n\r";
  }
  else {
    ch_00 = get_char_world(ch,local_1218);
    if (ch_00 == (CHAR_DATA *)0x0) {
      pcVar2 = "They aren\'t here.\n\r";
    }
    else {
      if (ch_00->level < ch->level) {
        uVar1 = ch_00->comm[0];
        if (((uint)uVar1 >> 0x16 & 1) == 0) {
          ch_00->comm[0] = uVar1 | 0x400000;
          send_to_char("The gods have revoked your channel privileges.\n\r",ch_00);
          send_to_char("NOCHANNELS set.\n\r",ch);
          pcVar2 = ch_00->name;
          __format = "$N revokes %s\'s channels.";
        }
        else {
          ch_00->comm[0] = uVar1 & 0xffffffffffbfffff;
          send_to_char("The gods have restored your channel privileges.\n\r",ch_00);
          send_to_char("NOCHANNELS removed.\n\r",ch);
          pcVar2 = ch_00->name;
          __format = "$N restores channels to %s";
        }
        sprintf(acStack_2418,__format,pcVar2);
        wiznet(acStack_2418,ch,(OBJ_DATA *)0x0,9,0xc,0);
        return;
      }
      pcVar2 = "You failed.\n\r";
    }
  }
  send_to_char(pcVar2,ch);
  return;
}

Assistant:

void do_nochannels(CHAR_DATA *ch, char *argument)
{
	char arg[MAX_INPUT_LENGTH], buf[MAX_STRING_LENGTH];
	CHAR_DATA *victim;

	one_argument(argument, arg);

	if (arg[0] == '\0')
	{
		send_to_char("Nochannel whom?\n\r", ch);
		return;
	}

	victim = get_char_world(ch, arg);

	if (victim == nullptr)
	{
		send_to_char("They aren't here.\n\r", ch);
		return;
	}

	if (ch->level <= victim->level)
	{
		send_to_char("You failed.\n\r", ch);
		return;
	}

	if (IS_SET(victim->comm, COMM_NOCHANNELS))
	{
		REMOVE_BIT(victim->comm, COMM_NOCHANNELS);

		send_to_char("The gods have restored your channel privileges.\n\r", victim);
		send_to_char("NOCHANNELS removed.\n\r", ch);

		sprintf(buf, "$N restores channels to %s", victim->name);
		wiznet(buf, ch, nullptr, WIZ_PENALTIES, WIZ_SECURE, 0);
	}
	else
	{
		SET_BIT(victim->comm, COMM_NOCHANNELS);

		send_to_char("The gods have revoked your channel privileges.\n\r", victim);
		send_to_char("NOCHANNELS set.\n\r", ch);

		sprintf(buf, "$N revokes %s's channels.", victim->name);
		wiznet(buf, ch, nullptr, WIZ_PENALTIES, WIZ_SECURE, 0);
	}
}